

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

size_t confidential_nonce_varint_from_bytes(uchar *bytes,uint64_t *v)

{
  long lVar1;
  size_t sVar2;
  uint64_t uVar3;
  
  if ((byte)(*bytes - 1) < 0xb) {
    lVar1 = (ulong)(byte)(*bytes - 1) * 8;
    uVar3 = *(uint64_t *)(&DAT_004add90 + lVar1);
    sVar2 = *(size_t *)(&DAT_004adde8 + lVar1);
  }
  else {
    sVar2 = 1;
    uVar3 = 0;
  }
  *v = uVar3;
  return sVar2;
}

Assistant:

static size_t confidential_commitment_varint_from_bytes(const unsigned char *bytes,
                                                        uint64_t *v,
                                                        bool ct_value)
{
    switch (*bytes) {
    case 1:
        *v = ct_value ? WALLY_TX_ASSET_CT_VALUE_UNBLIND_LEN : WALLY_TX_ASSET_CT_LEN;
        return *v;
    case WALLY_TX_ASSET_CT_VALUE_PREFIX_A:
    case WALLY_TX_ASSET_CT_VALUE_PREFIX_B:
    case WALLY_TX_ASSET_CT_ASSET_PREFIX_A:
    case WALLY_TX_ASSET_CT_ASSET_PREFIX_B:
    case WALLY_TX_ASSET_CT_NONCE_PREFIX_A:
    case WALLY_TX_ASSET_CT_NONCE_PREFIX_B:
        *v = WALLY_TX_ASSET_CT_LEN;
        return *v;
    }
    *v = 0;
    return sizeof(uint8_t);
}